

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

void __thiscall Helper::GenerateCorrelatedRandoms(Helper *this,int n)

{
  allocator<long> *this_00;
  long lVar1;
  long lVar2;
  int iVar3;
  size_type sVar4;
  time_t tVar5;
  reference pvVar6;
  ostream *poVar7;
  int local_29c;
  int local_298;
  int i_2;
  int i_1;
  int i;
  time_t t;
  ofstream fout;
  allocator<long> local_81;
  undefined1 local_80 [8];
  vector<long,_std::allocator<long>_> R;
  undefined1 local_60 [8];
  vector<long,_std::allocator<long>_> R2;
  allocator<long> local_31;
  undefined1 local_30 [8];
  vector<long,_std::allocator<long>_> R1;
  int n_local;
  Helper *this_local;
  
  R1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = n;
  std::allocator<long>::allocator(&local_31);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_30,(long)n,&local_31);
  std::allocator<long>::~allocator(&local_31);
  sVar4 = (size_type)
          R1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  this_00 = (allocator<long> *)
            ((long)&R.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<long>::allocator(this_00);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_60,sVar4,this_00);
  std::allocator<long>::~allocator
            ((allocator<long> *)
             ((long)&R.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar4 = (size_type)
          R1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  std::allocator<long>::allocator(&local_81);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_80,sVar4,&local_81);
  std::allocator<long>::~allocator(&local_81);
  std::ofstream::ofstream(&t);
  tVar5 = time((time_t *)&i_1);
  srand((uint)tVar5);
  for (i_2 = 0; i_2 < R1.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_; i_2 = i_2 + 1) {
    iVar3 = rand();
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_30,(long)i_2);
    *pvVar6 = (long)(iVar3 % 10000);
    iVar3 = rand();
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_60,(long)i_2);
    *pvVar6 = (long)(iVar3 % 10000);
    iVar3 = rand();
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_80,(long)i_2);
    *pvVar6 = (long)(iVar3 % 10000);
  }
  std::ofstream::open(&t,"../randoms/alice/Randoms_A.txt",0x10);
  for (local_298 = 0;
      local_298 <
      R1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; local_298 = local_298 + 1) {
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_30,(long)local_298);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&t,*pvVar6);
    std::operator<<(poVar7," ");
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_30,(long)local_298);
    lVar1 = *pvVar6;
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_60,(long)local_298);
    lVar2 = *pvVar6;
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_80,(long)local_298);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&t,lVar1 * lVar2 + *pvVar6);
    std::operator<<(poVar7,"\n");
  }
  std::ostream::flush();
  std::ofstream::close();
  std::ofstream::open(&t,"../randoms/bob/Randoms_B.txt",0x10);
  for (local_29c = 0;
      local_29c <
      R1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; local_29c = local_29c + 1) {
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_60,(long)local_29c);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&t,*pvVar6);
    std::operator<<(poVar7," ");
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_30,(long)local_29c);
    lVar1 = *pvVar6;
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_60,(long)local_29c);
    lVar2 = *pvVar6;
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_80,(long)local_29c);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&t,lVar1 * lVar2 - *pvVar6);
    std::operator<<(poVar7,"\n");
  }
  std::ostream::flush();
  std::ofstream::close();
  std::ofstream::~ofstream(&t);
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_80)
  ;
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_60)
  ;
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_30)
  ;
  return;
}

Assistant:

void Helper::GenerateCorrelatedRandoms(int n)
{
    std::vector<long> R1(n);
    std::vector<long> R2(n);
    std::vector<long> R(n);
    std::ofstream fout;
    time_t t;
    srand((unsigned)time(&t));

    for (int i = 0; i < n; i++)
    {
        R1[i] = rand()%10000;
        R2[i] = rand()%10000;
        R[i] = rand()%10000;
    }
    fout.open("../randoms/alice/Randoms_A.txt");
    for (int i = 0; i < n; i++)
    {
        fout << R1[i] << " ";
        fout << R1[i] * R2[i] + R[i] << "\n";
    }
    fout.flush();
    fout.close();
    fout.open("../randoms/bob/Randoms_B.txt");
    for (int i = 0; i < n; i++)
    {
        fout << R2[i] << " ";
        fout << R1[i] * R2[i] - R[i] << "\n";
    }
    fout.flush();
    fout.close();
}